

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O1

UnicodeString *
anon_unknown.dwarf_188b6b::getWithPlural
          (UnicodeString *__return_storage_ptr__,UnicodeString *strings,Form plural,
          UErrorCode *status)

{
  icu_63::UnicodeString::UnicodeString(__return_storage_ptr__,strings + plural);
  if ((undefined1  [56])((undefined1  [56])__return_storage_ptr__->fUnion & (undefined1  [56])0x1)
      != (undefined1  [56])0x0) {
    icu_63::UnicodeString::operator=(__return_storage_ptr__,strings + 5);
  }
  if ((undefined1  [56])((undefined1  [56])__return_storage_ptr__->fUnion & (undefined1  [56])0x1)
      != (undefined1  [56])0x0) {
    *status = U_INTERNAL_PROGRAM_ERROR;
  }
  return __return_storage_ptr__;
}

Assistant:

static UnicodeString getWithPlural(
        const UnicodeString* strings,
        StandardPlural::Form plural,
        UErrorCode& status) {
    UnicodeString result = strings[plural];
    if (result.isBogus()) {
        result = strings[StandardPlural::Form::OTHER];
    }
    if (result.isBogus()) {
        // There should always be data in the "other" plural variant.
        status = U_INTERNAL_PROGRAM_ERROR;
    }
    return result;
}